

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators)

{
  pointer ppcVar1;
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer ppcVar2;
  cmGeneratorTarget *this_01;
  TargetType TVar3;
  pointer ppcVar4;
  ostream *poVar5;
  pointer ppcVar6;
  cmGeneratorTarget *gt;
  string tname;
  string local_50;
  
  std::operator<<((ostream *)cmakefileStream,"# Dependency information for all targets:\n");
  std::operator<<((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n");
  ppcVar4 = (lGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (lGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppcVar4 == ppcVar1) {
      std::operator<<((ostream *)cmakefileStream,"  )\n");
      return;
    }
    this_00 = (cmLocalUnixMakefileGenerator3 *)*ppcVar4;
    ppcVar2 = (this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar6 = (this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar2;
        ppcVar6 = ppcVar6 + 1) {
      this_01 = *ppcVar6;
      TVar3 = cmGeneratorTarget::GetType(this_01);
      if (TVar3 == EXECUTABLE) {
LAB_00317206:
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  (&local_50,this_00,this_01);
        std::__cxx11::string::append((char *)&local_50);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_50);
        poVar5 = std::operator<<((ostream *)cmakefileStream,"  \"");
        poVar5 = std::operator<<(poVar5,(string *)&local_50);
        std::operator<<(poVar5,"\"\n");
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        TVar3 = cmGeneratorTarget::GetType(this_01);
        if (TVar3 == STATIC_LIBRARY) goto LAB_00317206;
        TVar3 = cmGeneratorTarget::GetType(this_01);
        if (TVar3 == SHARED_LIBRARY) goto LAB_00317206;
        TVar3 = cmGeneratorTarget::GetType(this_01);
        if (TVar3 == MODULE_LIBRARY) goto LAB_00317206;
        TVar3 = cmGeneratorTarget::GetType(this_01);
        if (TVar3 == OBJECT_LIBRARY) goto LAB_00317206;
        TVar3 = cmGeneratorTarget::GetType(this_01);
        if (TVar3 == UTILITY) goto LAB_00317206;
      }
    }
    ppcVar4 = ppcVar4 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules(
  cmGeneratedFileStream& cmakefileStream,
  std::vector<cmLocalGenerator*>& lGenerators)
{
  cmLocalUnixMakefileGenerator3* lg;

  // now list all the target info files
  cmakefileStream << "# Dependency information for all targets:\n";
  cmakefileStream << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (cmLocalGenerator* lGenerator : lGenerators) {
    lg = static_cast<cmLocalUnixMakefileGenerator3*>(lGenerator);
    // for all of out targets
    for (cmGeneratorTarget* tgt : lg->GetGeneratorTargets()) {
      if ((tgt->GetType() == cmStateEnums::EXECUTABLE) ||
          (tgt->GetType() == cmStateEnums::STATIC_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::SHARED_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::MODULE_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::UTILITY)) {
        cmGeneratorTarget* gt = tgt;
        std::string tname = lg->GetRelativeTargetDirectory(gt);
        tname += "/DependInfo.cmake";
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
      }
    }
  }
  cmakefileStream << "  )\n";
}